

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O3

int get_file_info(char *filename,UpnpFileInfo *info)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  off_t oVar7;
  tm *__tp;
  char *pcVar8;
  int iVar9;
  int iVar10;
  char *__s;
  time_t aux_LastModified;
  char buffer [26];
  stat s;
  tm date;
  
  UpnpFileInfo_set_ContentType(info,(char *)0x0);
  __stream = fopen(filename,"r");
  UpnpFileInfo_set_IsReadable(info,(uint)(__stream != (FILE *)0x0));
  iVar10 = -1;
  if (__stream != (FILE *)0x0) {
    iVar1 = fileno(__stream);
    if ((iVar1 == -1) || (iVar1 = fstat(iVar1,(stat *)&s), iVar1 == -1)) {
      fclose(__stream);
    }
    else {
      fclose(__stream);
      if ((s.st_mode & 0xf000) == 0x4000) {
        iVar10 = 1;
      }
      else {
        if ((s.st_mode & 0xf000) != 0x8000) {
          return -1;
        }
        iVar10 = 0;
      }
      UpnpFileInfo_set_IsDirectory(info,iVar10);
      UpnpFileInfo_set_FileLength(info,s.st_size);
      UpnpFileInfo_set_LastModified(info,s.st_mtim.tv_sec);
      iVar10 = 0;
      UpnpFileInfo_set_ContentType(info,(char *)0x0);
      pcVar4 = strrchr(filename,0x2e);
      __s = "octet-stream";
      pcVar8 = "application";
      if (pcVar4 != (char *)0x0) {
        iVar1 = 0x45;
        do {
          iVar9 = (iVar10 + iVar1) / 2;
          iVar2 = strcasecmp(pcVar4 + 1,gMediaTypeList[iVar9].file_ext);
          if (iVar2 < 1) {
            if (-1 < iVar2) {
              pcVar8 = gMediaTypeList[iVar9].content_type;
              __s = gMediaTypeList[iVar9].content_subtype;
              goto LAB_00112320;
            }
            iVar1 = iVar9 + -1;
          }
          else {
            iVar10 = iVar9 + 1;
          }
        } while (iVar10 <= iVar1);
        __s = "octet-stream";
        pcVar8 = "application";
      }
LAB_00112320:
      sVar5 = strlen(pcVar8);
      sVar6 = strlen(__s);
      sVar5 = sVar5 + sVar6 + 2;
      pcVar4 = (char *)malloc(sVar5);
      iVar10 = -0x68;
      if (pcVar4 != (char *)0x0) {
        uVar3 = snprintf(pcVar4,sVar5,"%s/%s",pcVar8,__s);
        if ((int)uVar3 < 0 || sVar5 <= uVar3) {
          free(pcVar4);
        }
        else {
          UpnpFileInfo_set_ContentType(info,pcVar4);
          free(pcVar4);
          pcVar8 = UpnpFileInfo_get_ContentType(info);
          iVar10 = 0;
          if (pcVar8 == (char *)0x0) {
            iVar10 = -0x68;
          }
        }
      }
      aux_LastModified = UpnpFileInfo_get_LastModified(info);
      oVar7 = UpnpFileInfo_get_FileLength(info);
      __tp = gmtime_r(&aux_LastModified,(tm *)&date);
      pcVar8 = asctime_r(__tp,buffer);
      uVar3 = UpnpFileInfo_get_IsReadable(info);
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x244,
                 "file info: %s, length: %ld, last_mod=%s readable=%d\n",filename,oVar7,pcVar8,
                 (ulong)uVar3);
    }
  }
  return iVar10;
}

Assistant:

static int get_file_info(
	/*! [in] Filename having the description document. */
	const char *filename,
	/*! [out] File information object having file attributes such as
	 * filelength, when was the file last modified, whether a file or a
	 * directory and whether the file or directory is readable. */
	UpnpFileInfo *info)
{
	int code;
	struct stat s;
	FILE *fp;
	int fd;
	int rc = 0;
	time_t aux_LastModified;
	struct tm date;
	char buffer[ASCTIME_R_BUFFER_SIZE];

	UpnpFileInfo_set_ContentType(info, NULL);
	#ifdef _WIN32
	fopen_s(&fp, filename, "r");
	#else
	fp = fopen(filename, "r");
	#endif
	/* check readable */
	UpnpFileInfo_set_IsReadable(info, fp != NULL);
	if (!fp) {
		rc = -1;
		goto exit_function;
	}
	fd = fileno(fp);
	if (fd == -1) {
		rc = -1;
		goto exit_function;
	}
	code = fstat(fd, &s);
	if (code == -1) {
		rc = -1;
		goto exit_function;
	}
	fclose(fp);
	fp = NULL;
	if (S_ISDIR(s.st_mode)) {
		UpnpFileInfo_set_IsDirectory(info, 1);
	} else if (S_ISREG(s.st_mode)) {
		UpnpFileInfo_set_IsDirectory(info, 0);
	} else {
		rc = -1;
		goto exit_function;
	}
	UpnpFileInfo_set_FileLength(info, s.st_size);
	UpnpFileInfo_set_LastModified(info, s.st_mtime);
	rc = get_content_type(filename, info);
	aux_LastModified = UpnpFileInfo_get_LastModified(info);
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"file info: %s, length: %" PRId64 ", last_mod=%s readable=%d\n",
		filename,
		(int64_t)UpnpFileInfo_get_FileLength(info),
		web_server_asctime_r(
			http_gmtime_r(&aux_LastModified, &date), buffer),
		UpnpFileInfo_get_IsReadable(info));

exit_function:
	if (fp) {
		fclose(fp);
	}
	return rc;
}